

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

bool __thiscall QGraphicsObject::event(QGraphicsObject *this,QEvent *ev)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  socklen_t *in_RCX;
  sockaddr *__addr;
  int __fd;
  QEvent *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  QRectF *rect;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  QRectF local_28;
  long local_8;
  QEvent *pQVar4;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RSI;
  rect = in_RDI;
  TVar3 = QEvent::type(in_RSI);
  __fd = (int)pQVar4;
  if (TVar3 == StyleAnimationUpdate) {
    bVar1 = QGraphicsItem::isVisible((QGraphicsItem *)0x987789);
    if (bVar1) {
      QEvent::accept(in_RSI,__fd,__addr,in_RCX);
      QRectF::QRectF(&local_28);
      QGraphicsItem::update
                ((QGraphicsItem *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),rect
                );
    }
    bVar1 = true;
  }
  else {
    bVar2 = QObject::event((QEvent *)in_RDI);
    bVar1 = (bool)(bVar2 & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QGraphicsObject::event(QEvent *ev)
{
    if (ev->type() == QEvent::StyleAnimationUpdate) {
        if (isVisible()) {
            ev->accept();
            update();
        }
        return true;
    }
    return QObject::event(ev);
}